

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.c
# Opt level: O0

int repeat_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  float fVar1;
  uint uVar2;
  repeat_segment_data *data_00;
  int iVar3;
  double dVar4;
  uint32_t index;
  float position;
  float time;
  uint32_t samplerate;
  repeat_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  data_00 = (repeat_segment_data *)segment->data;
  if (field == 1) {
    if ((*value & 1) == 0) {
      segment->mix = repeat_segment_mix;
    }
    else {
      segment->mix = repeat_segment_mix_bypass;
    }
  }
  else if (field == 2) {
    if (*value == 0) {
      mixed_err(8);
      return 0;
    }
    uVar2 = *value;
    dVar4 = ceil((double)((float)uVar2 * data_00->time));
    iVar3 = repeat_segment_data_resize_buffer(data_00,(uint32_t)(long)dVar4);
    if (iVar3 == 0) {
      return 0;
    }
    data_00->samplerate = uVar2;
  }
  else if (field == 0x1e) {
    if (*value <= 0.0) {
      mixed_err(8);
      return 0;
    }
    fVar1 = *value;
    dVar4 = ceil((double)((float)data_00->samplerate * fVar1));
    iVar3 = repeat_segment_data_resize_buffer(data_00,(uint32_t)(long)dVar4);
    if (iVar3 == 0) {
      return 0;
    }
    data_00->time = fVar1;
  }
  else if (field == 0x1f) {
    if (((*value != 1) && (*value != 2)) && (*value != 3)) {
      mixed_err(8);
      return 0;
    }
    data_00->mode = *value;
  }
  else {
    if (field != 0x38) {
      mixed_err(7);
      return 0;
    }
    if (*value < 0.0) {
      mixed_err(8);
      return 0;
    }
    dVar4 = ceil((double)(*value * (float)data_00->samplerate));
    if (data_00->buffer_size <= (uint)(long)dVar4) {
      mixed_err(8);
      return 0;
    }
    data_00->buffer_index = (uint)(long)dVar4;
  }
  return 1;
}

Assistant:

int repeat_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct repeat_segment_data *data = (struct repeat_segment_data *)segment->data;
  switch(field){
  case MIXED_SAMPLERATE:
    if(*(uint32_t *)value <= 0){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    uint32_t samplerate = *(uint32_t *)value;
    if (!repeat_segment_data_resize_buffer(data, ceil(samplerate * data->time))){
      return 0;
    }
    data->samplerate = samplerate;
    break;
  case MIXED_REPEAT_TIME:
    if(*(float *)value <= 0.0f){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    float time = *(float *)value;
    if (!repeat_segment_data_resize_buffer(data, ceil(data->samplerate * time))){
      return 0;
    }
    data->time = time;
    break;
  case MIXED_REPEAT_MODE:
    if(*(enum mixed_repeat_mode *)value != MIXED_RECORD &&
       *(enum mixed_repeat_mode *)value != MIXED_PLAY &&
       *(enum mixed_repeat_mode *)value != MIXED_RECORD_ONCE){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->mode = *(enum mixed_repeat_mode *)value;
    break;
  case MIXED_REPEAT_POSITION: {
    float position = (*(float *)value);
    if(position < 0.0f){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    uint32_t index = ceil(position * data->samplerate);
    if(index >= data->buffer_size){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->buffer_index = index;
    break;
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = repeat_segment_mix_bypass;
    }else{
      segment->mix = repeat_segment_mix;
    }
    break;}
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}